

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

bcf1_t * bcf_copy(bcf1_t *dst,bcf1_t *src)

{
  byte bVar1;
  undefined2 uVar2;
  ushort uVar3;
  size_t sVar4;
  uint32_t uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  
  bcf1_sync(src);
  bcf_clear(dst);
  uVar5 = src->pos;
  dst->rid = src->rid;
  dst->pos = uVar5;
  dst->rlen = src->rlen;
  dst->qual = src->qual;
  uVar2 = *(undefined2 *)&src->field_0x10;
  uVar6 = CONCAT62((int6)((ulong)*(undefined8 *)&dst->field_0x10 >> 0x10),uVar2);
  *(ulong *)&dst->field_0x10 = uVar6;
  uVar3 = *(ushort *)&src->field_0x12;
  uVar8 = (ulong)uVar3 << 0x10;
  *(ulong *)&dst->field_0x10 = uVar6 & 0xffffffff0000ffff | uVar8;
  bVar1 = src->field_0x14;
  *(ulong *)&dst->field_0x10 = uVar6 & 0xffffff000000ffff | uVar8 | (ulong)bVar1 << 0x20;
  *(ulong *)&dst->field_0x10 =
       (ulong)CONCAT14(bVar1,CONCAT22(uVar3,uVar2)) |
       *(ulong *)&src->field_0x10 & 0xffffff0000000000;
  sVar4 = (src->shared).l;
  (dst->shared).l = sVar4;
  (dst->shared).m = sVar4;
  pcVar7 = (char *)malloc(sVar4);
  (dst->shared).s = pcVar7;
  memcpy(pcVar7,(src->shared).s,sVar4);
  sVar4 = (src->indiv).l;
  (dst->indiv).l = sVar4;
  (dst->indiv).m = sVar4;
  pcVar7 = (char *)malloc(sVar4);
  (dst->indiv).s = pcVar7;
  memcpy(pcVar7,(src->indiv).s,sVar4);
  return dst;
}

Assistant:

bcf1_t *bcf_copy(bcf1_t *dst, bcf1_t *src)
{
    bcf1_sync(src);

    bcf_clear(dst);
    dst->rid  = src->rid;
    dst->pos  = src->pos;
    dst->rlen = src->rlen;
    dst->qual = src->qual;
    dst->n_info = src->n_info; dst->n_allele = src->n_allele;
    dst->n_fmt = src->n_fmt; dst->n_sample = src->n_sample;

    dst->shared.m = dst->shared.l = src->shared.l;
    dst->shared.s = (char*) malloc(dst->shared.l);
    memcpy(dst->shared.s,src->shared.s,dst->shared.l);

    dst->indiv.m = dst->indiv.l = src->indiv.l;
    dst->indiv.s = (char*) malloc(dst->indiv.l);
    memcpy(dst->indiv.s,src->indiv.s,dst->indiv.l);

    return dst;
}